

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

int signo3(int A,int B)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  uint uVar17;
  uint uVar19;
  
  iVar3 = tq + tp;
  if (iVar3 < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = iVar3 - 1;
    auVar10._4_4_ = A;
    auVar10._0_4_ = A;
    auVar10._8_4_ = A;
    auVar10._12_4_ = A;
    auVar15 = ZEXT816(0);
    auVar11 = _DAT_00108030;
    iVar5 = 4;
    do {
      auVar8 = auVar15;
      auVar9 = pshuflw(auVar8,auVar11,0xfe);
      auVar14 = pshuflw(in_XMM7,auVar11,0x54);
      iVar6 = auVar11._4_4_;
      iVar7 = auVar11._8_4_;
      iVar12 = auVar11._12_4_;
      auVar13._0_8_ = auVar11._8_8_;
      auVar13._8_4_ = iVar7;
      auVar13._12_4_ = iVar12;
      auVar15 = pshuflw(auVar14,auVar13,0xfe);
      uVar19 = A >> auVar15;
      auVar1._4_8_ = auVar10._8_8_;
      auVar1._0_4_ = uVar19;
      auVar18._0_8_ = auVar1._0_8_ << 0x20;
      auVar18._8_4_ = uVar19;
      auVar18._12_4_ = uVar19;
      auVar15 = pshuflw(auVar13,auVar13,0x54);
      uVar17 = A >> auVar15;
      auVar2._4_8_ = auVar10._8_8_;
      auVar2._0_4_ = uVar17;
      auVar16._0_8_ = auVar2._0_8_ << 0x20;
      auVar16._8_4_ = uVar17;
      auVar16._12_4_ = uVar17;
      in_XMM7._8_8_ = auVar18._8_8_;
      in_XMM7._0_8_ = auVar16._8_8_;
      auVar15._0_4_ = A >> auVar14 ^ auVar8._0_4_;
      auVar15._4_4_ = A >> auVar9 ^ auVar8._4_4_;
      auVar15._8_4_ = uVar17 ^ auVar8._8_4_;
      auVar15._12_4_ = uVar19 ^ auVar8._12_4_;
      auVar11._0_4_ = auVar11._0_4_ + 4;
      auVar11._4_4_ = iVar6 + 4;
      auVar11._8_4_ = iVar7 + 4;
      auVar11._12_4_ = iVar12 + 4;
      iVar6 = iVar5 + -4;
      iVar7 = iVar5 + (iVar3 + 3U & 0xfffffffc);
      iVar5 = iVar6;
    } while (iVar7 != 8);
    uVar17 = -iVar6;
    auVar9._0_4_ = -(uint)((int)(uVar4 ^ 0x80000000) < (int)(uVar17 ^ 0x80000000));
    auVar9._4_4_ = -(uint)((int)(uVar4 ^ 0x80000000) < (int)((uVar17 | 1) ^ 0x80000000));
    auVar9._8_4_ = -(uint)((int)(uVar4 ^ 0x80000000) < (int)((uVar17 | 2) ^ 0x80000000));
    auVar9._12_4_ = -(uint)((int)(uVar4 ^ 0x80000000) < (int)((uVar17 | 3) ^ 0x80000000));
    auVar15 = ~auVar9 & auVar15 | auVar8 & auVar9;
    auVar8._0_8_ = auVar15._8_8_;
    auVar8._8_4_ = auVar15._8_4_;
    auVar8._12_4_ = auVar15._12_4_;
    uVar4 = SUB164(auVar8 ^ auVar15,4) ^ SUB164(auVar8 ^ auVar15,0);
  }
  uVar4 = (A & B) >> ((byte)tp & 0x1f) ^ uVar4 & B;
  uVar4 = (int)uVar4 >> 8 ^ uVar4;
  uVar4 = (int)uVar4 >> 4 ^ uVar4;
  uVar4 = (int)uVar4 >> 2 ^ uVar4;
  return -((uVar4 >> 1 ^ uVar4) & 1) | 1;
}

Assistant:

int signo3(int A,int B)
{
	
	int tA2=0,n=(tp+tq); 
	for(int i=1;i<=n;i++)
		tA2^=(A>>i);

	tA2&=B;
	tA2^=(A&B)>>tp;
	tA2^=(tA2>>8);
	tA2^=(tA2>>4);
	tA2^=(tA2>>2);
	tA2^=(tA2>>1);
		
	if(tA2&1)return -1;
	return 1;
}